

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<Fad<Fad<double>_>_>::Resize
          (TPZVec<Fad<Fad<double>_>_> *this,int64_t newsize,Fad<Fad<double>_> *object)

{
  double dVar1;
  undefined1 auVar2 [16];
  Fad<Fad<double>_> *pFVar3;
  ostream *this_00;
  ulong uVar4;
  ulong in_RSI;
  long in_RDI;
  ulong uVar5;
  int64_t i;
  int64_t large;
  Fad<Fad<double>_> *newstore;
  Fad<Fad<double>_> *in_stack_ffffffffffffff38;
  Fad<Fad<double>_> *in_stack_ffffffffffffff40;
  Fad<Fad<double>_> *local_a8;
  Fad<Fad<double>_> *in_stack_ffffffffffffff60;
  Fad<Fad<double>_> *pFVar6;
  ulong local_98;
  ulong *local_70;
  long local_40;
  ulong *local_20;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      local_20 = (ulong *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_RSI;
      uVar4 = SUB168(auVar2 * ZEXT816(0x58),0);
      uVar5 = uVar4 + 8;
      if (SUB168(auVar2 * ZEXT816(0x58),8) != 0 || 0xfffffffffffffff7 < uVar4) {
        uVar5 = 0xffffffffffffffff;
      }
      local_20 = (ulong *)operator_new__(uVar5);
      *local_20 = in_RSI;
      local_20 = local_20 + 1;
      if (in_RSI != 0) {
        local_70 = local_20;
        do {
          Fad<Fad<double>_>::Fad(in_stack_ffffffffffffff60);
          local_70 = local_70 + 0xb;
        } while (local_70 != local_20 + in_RSI * 0xb);
      }
    }
    local_98 = in_RSI;
    if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
      local_98 = *(ulong *)(in_RDI + 0x10);
    }
    for (local_40 = 0; local_40 < (long)local_98; local_40 = local_40 + 1) {
      Fad<Fad<double>_>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    for (; local_40 < (long)in_RSI; local_40 = local_40 + 1) {
      Fad<Fad<double>_>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      pFVar6 = *(Fad<Fad<double>_> **)(in_RDI + 8);
      if (pFVar6 != (Fad<Fad<double>_> *)0x0) {
        pFVar3 = pFVar6 + -1;
        dVar1 = pFVar6[-1].defaultVal.defaultVal;
        local_a8 = pFVar6 + (long)dVar1;
        if (pFVar6 != local_a8) {
          do {
            local_a8 = local_a8 + -1;
            Fad<Fad<double>_>::~Fad(local_a8);
          } while (local_a8 != pFVar6);
        }
        operator_delete__(&(pFVar3->defaultVal).defaultVal,(long)dVar1 * 0x58 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    *(ulong **)(in_RDI + 8) = local_20;
    *(ulong *)(in_RDI + 0x10) = in_RSI;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}